

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::ParseContext::ReadSizeAndPushLimitAndDepth
          (ParseContext *this,char *ptr,LimitToken *old_limit)

{
  undefined8 in_RAX;
  char *pcVar1;
  pair<const_char_*,_int> pVar2;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  if (*ptr < '\0') {
    pVar2 = ReadSizeFallback(ptr,(uint)(byte)*ptr);
    pcVar1 = pVar2.first;
  }
  else {
    pcVar1 = ptr + 1;
  }
  if ((pcVar1 == (char *)0x0) || (this->depth_ < 1)) {
    pcVar1 = (char *)0x0;
  }
  else {
    EpsCopyInputStream::PushLimit
              ((EpsCopyInputStream *)&stack0xffffffffffffffdc,(char *)this,(int)pcVar1);
    old_limit->token_ = local_24;
    this->depth_ = this->depth_ + -1;
  }
  return pcVar1;
}

Assistant:

const char* ParseContext::ReadSizeAndPushLimitAndDepth(const char* ptr,
                                                       LimitToken* old_limit) {
  return ReadSizeAndPushLimitAndDepthInlined(ptr, old_limit);
}